

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

ParseNodeCatch * __thiscall Parser::ParseCatch<true>(Parser *this)

{
  int scopeId;
  ParseNodePtr *ppPVar1;
  anon_union_8_2_ecfd7102_for_StmtNest_0 this_00;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  charcount_t cVar5;
  Scanner_t *pSVar6;
  undefined4 *puVar7;
  ParseNodePtr pPVar8;
  ParseNodeParamPattern *pnode_00;
  HashTbl *pHVar9;
  IdentPtr pIVar10;
  ParseNodeFnc *pPVar11;
  PidRefStack *ref_00;
  ParseNodeName *this_01;
  LPCOLESTR string;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *alloc;
  Symbol *pSVar12;
  ParseNodeBlock *pPVar13;
  ScopeType scopeType;
  ParseNodePtr pnodeBody;
  charcount_t ichLim;
  Scope *scope_1;
  TrackAllocData local_c8;
  Symbol *local_a0;
  Symbol *sym;
  SymbolName symName;
  int nameLength;
  char16 *name;
  ParseNodeName *pnodeParam;
  PidRefStack *ref;
  IdentPtr pid;
  Scope *scope;
  ParseNodePtr pnodePattern;
  bool hasParam;
  bool isPattern;
  charcount_t ichMin;
  IdentPtr pidCatch;
  StmtNest stmt;
  ParseNodeBlock *pnodeCatchScope;
  ParseNodeCatch *pnode;
  ParseNodePtr *ppnodeExprScopeSave;
  Parser *this_local;
  
  pnodeCatchScope = (ParseNodeBlock *)0x0;
  stmt.pstmtOuter = (StmtNest *)0x0;
  if ((this->m_token).tk == tkCATCH) {
    pSVar6 = GetScanner(this);
    cVar5 = Scanner<UTF8EncodingPolicyBase<false>_>::IchMinTok(pSVar6);
    pSVar6 = GetScanner(this);
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar6);
    pnodePattern._3_1_ = false;
    bVar4 = false;
    if ((this->m_token).tk == tkLParen) {
      bVar4 = true;
      pSVar6 = GetScanner(this);
      Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar6);
      if (((this->m_token).tk != tkID) &&
         (pnodePattern._3_1_ = IsPossiblePatternStart(this), !pnodePattern._3_1_)) {
        IdentifierExpectedError(this,&this->m_token);
      }
    }
    pnodeCatchScope = (ParseNodeBlock *)CreateNodeForOpT<(OpCode)106>(this,cVar5);
    pnodeCatchScope->pnodeStmt = (ParseNodePtr)0x0;
    PushStmt<true>(this,(StmtNest *)&pidCatch,(ParseNodeStmt *)pnodeCatchScope,knopCatch,
                   (LabelId *)0x0);
    scopeType = ScopeType_Catch;
    if (pnodePattern._3_1_ != false) {
      scopeType = ScopeType_CatchParamPattern;
    }
    stmt.pstmtOuter = (StmtNest *)StartParseBlock<true>(this,Regular,scopeType,(LabelId *)0x0);
    if (this->m_ppnodeExprScope == (ParseNodePtr *)0x0) {
      if (this->m_ppnodeScope == (ParseNodePtr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                           ,0x26db,"(m_ppnodeScope)","m_ppnodeScope");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      if (*this->m_ppnodeScope != (ParseNodePtr)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                           ,0x26dc,"(*m_ppnodeScope == nullptr)","*m_ppnodeScope == nullptr");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      *this->m_ppnodeScope = (ParseNodePtr)pnodeCatchScope;
      this->m_ppnodeScope = &pnodeCatchScope->pnodeStmt;
    }
    else {
      if (*this->m_ppnodeExprScope != (ParseNodePtr)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                           ,0x26d5,"(*m_ppnodeExprScope == nullptr)","*m_ppnodeExprScope == nullptr"
                          );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      *this->m_ppnodeExprScope = (ParseNodePtr)pnodeCatchScope;
      this->m_ppnodeExprScope = &pnodeCatchScope->pnodeStmt;
    }
    ppPVar1 = this->m_ppnodeExprScope;
    this->m_ppnodeExprScope = &pnodeCatchScope->pnodeScopes;
    pnodeCatchScope->pnodeScopes = (ParseNodePtr)0x0;
    if (pnodePattern._3_1_ == false) {
      if (bVar4) {
        bVar3 = IsStrictMode(this);
        if (bVar3) {
          pHVar9 = GetHashTbl(this);
          pIVar10 = Token::GetIdentifier((Token *)&this->m_token,pHVar9);
          if (pIVar10 == (this->wellKnownPropertyPids).eval) {
            Error(this,-0x7ff5fbef,L"",L"");
          }
          if (pIVar10 == (this->wellKnownPropertyPids).arguments) {
            Error(this,-0x7ff5fbee,L"",L"");
          }
        }
        pHVar9 = GetHashTbl(this);
        pIVar10 = Token::GetIdentifier((Token *)&this->m_token,pHVar9);
        pPVar13 = GetCurrentBlock(this);
        scopeId = pPVar13->blockId;
        pPVar11 = GetCurrentFunctionNode(this);
        ref_00 = FindOrAddPidRef(this,pIVar10,scopeId,pPVar11->functionId);
        this_01 = CreateNameNode(this,pIVar10);
        ParseNodeName::SetSymRef(this_01,ref_00);
        string = Ident::Psz(pIVar10);
        symName._12_4_ = Ident::Cch(pIVar10);
        JsUtil::CharacterBuffer<char16_t>::CharacterBuffer
                  ((CharacterBuffer<char16_t> *)&sym,string,symName._12_4_);
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_c8,(type_info *)&Symbol::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                   ,0x270a);
        alloc = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *
                               )this,&local_c8);
        pSVar12 = (Symbol *)new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)alloc,0x3f67b0);
        Symbol::Symbol(pSVar12,(SymbolName *)&sym,&this_01->super_ParseNode,STVariable);
        local_a0 = pSVar12;
        if (pSVar12 == (Symbol *)0x0) {
          Error(this,-0x7ff5fc17,L"",L"");
        }
        Symbol::SetPid(pSVar12,pIVar10);
        pSVar12 = PidRefStack::GetSym(ref_00);
        if (pSVar12 != (Symbol *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                             ,10000,"(ref->GetSym() == nullptr)","ref->GetSym() == nullptr");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        PidRefStack::SetSym(ref_00,local_a0);
        this_00 = stmt.pstmtOuter[3].field_0;
        Scope::AddNewSymbol((Scope *)this_00,local_a0);
        ParseNodeCatch::SetParam((ParseNodeCatch *)pnodeCatchScope,this_01);
        pnodeCatchScope->pnodeNext = (ParseNodePtr)this_00;
        pSVar6 = GetScanner(this);
        Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar6);
      }
      else {
        pnodeCatchScope->pnodeNext = (ParseNodePtr)stmt.pstmtOuter[3].field_0;
      }
    }
    else {
      pPVar8 = ParseDestructuredLiteral<true>
                         (this,tkLET,true,true,DIC_ForceErrorOnInitializer,true,(BOOL *)0x0,
                          (BOOL *)0x0);
      pnode_00 = CreateParamPatternNode(this,pPVar8);
      ParseNodeCatch::SetParam((ParseNodeCatch *)pnodeCatchScope,pnode_00);
      pnodeCatchScope->pnodeNext = (ParseNodePtr)stmt.pstmtOuter[3].field_0;
    }
    pSVar6 = GetScanner(this);
    cVar5 = Scanner<UTF8EncodingPolicyBase<false>_>::IchLimTok(pSVar6);
    if (bVar4) {
      ChkCurTok(this,0x50,-0x7ff5fc12);
    }
    if ((this->m_token).tk != tkLCurly) {
      Error(this,-0x7ff5fc10,L"",L"");
    }
    pPVar8 = ParseStatement<true>(this);
    pnodeCatchScope->pnodeLexVars = pPVar8;
    (pnodeCatchScope->super_ParseNodeStmt).super_ParseNode.ichLim = cVar5;
    if (stmt.pstmtOuter != (StmtNest *)0x0) {
      FinishParseBlock(this,(ParseNodeBlock *)stmt.pstmtOuter,true);
    }
    bVar4 = ParseNodeBlock::GetCallsEval((ParseNodeBlock *)stmt.pstmtOuter);
    if ((bVar4) ||
       (bVar4 = ParseNodeBlock::GetChildCallsEval((ParseNodeBlock *)stmt.pstmtOuter), bVar4)) {
      pPVar13 = GetCurrentBlock(this);
      ParseNodeBlock::SetChildCallsEval(pPVar13,true);
    }
    bVar4 = ParseNodeBlock::GetCallsEval((ParseNodeBlock *)stmt.pstmtOuter);
    if (bVar4) {
      pPVar13 = ParseNode::AsParseNodeBlock(pPVar8);
      ParseNodeBlock::SetCallsEval(pPVar13,true);
    }
    bVar4 = ParseNodeBlock::GetChildCallsEval((ParseNodeBlock *)stmt.pstmtOuter);
    if (bVar4) {
      pPVar13 = ParseNode::AsParseNodeBlock(pPVar8);
      ParseNodeBlock::SetChildCallsEval(pPVar13,true);
    }
    PopStmt(this,(StmtNest *)&pidCatch);
    if (this->m_ppnodeExprScope == (ParseNodePtr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x2756,"(m_ppnodeExprScope)","m_ppnodeExprScope");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    if (*this->m_ppnodeExprScope != (ParseNodePtr)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x2757,"(*m_ppnodeExprScope == nullptr)","*m_ppnodeExprScope == nullptr");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    this->m_ppnodeExprScope = ppPVar1;
  }
  return (ParseNodeCatch *)pnodeCatchScope;
}

Assistant:

ParseNodeCatch * Parser::ParseCatch()
{
    ParseNodePtr *ppnodeExprScopeSave = nullptr;
    ParseNodeCatch * pnode = nullptr;
    ParseNodeBlock * pnodeCatchScope = nullptr;
    StmtNest stmt;
    IdentPtr pidCatch = nullptr;

    if (tkCATCH == m_token.tk)
    {
        charcount_t ichMin;
        if (buildAST)
        {
            ichMin = this->GetScanner()->IchMinTok();
        }
        this->GetScanner()->Scan(); //catch

        bool isPattern = false;
        bool hasParam = false;

        if (tkLParen == m_token.tk)
        {
            hasParam = true;
            this->GetScanner()->Scan(); //catch(
            if (tkID != m_token.tk)
            {
                isPattern = IsPossiblePatternStart();
                if (!isPattern)
                {
                    IdentifierExpectedError(m_token);
                }
            }
        }

        if (buildAST)
        {
            pnode = CreateNodeForOpT<knopCatch>(ichMin);
            pnode->pnodeNext = nullptr;
            PushStmt<buildAST>(&stmt, pnode, knopCatch, nullptr);
        }

        pnodeCatchScope = StartParseBlock<buildAST>(PnodeBlockType::Regular, isPattern ? ScopeType_CatchParamPattern : ScopeType_Catch);

        if (buildAST)
        {
            // Add this catch to the current scope list.

            if (m_ppnodeExprScope)
            {
                Assert(*m_ppnodeExprScope == nullptr);
                *m_ppnodeExprScope = pnode;
                m_ppnodeExprScope = &pnode->pnodeNext;
            }
            else
            {
                Assert(m_ppnodeScope);
                Assert(*m_ppnodeScope == nullptr);
                *m_ppnodeScope = pnode;
                m_ppnodeScope = &pnode->pnodeNext;
            }

            // Keep a list of function expressions (not declarations) at this scope.

            ppnodeExprScopeSave = m_ppnodeExprScope;
            m_ppnodeExprScope = &pnode->pnodeScopes;
            pnode->pnodeScopes = nullptr;
        }

        if (isPattern)
        {
            ParseNodePtr pnodePattern = ParseDestructuredLiteral<buildAST>(tkLET, true /*isDecl*/, true /*topLevel*/, DIC_ForceErrorOnInitializer);
            if (buildAST)
            {
                pnode->SetParam(CreateParamPatternNode(pnodePattern));
                Scope *scope = pnodeCatchScope->scope;
                pnode->scope = scope;
            }
        }
        else if (hasParam)
        {
            if (IsStrictMode())
            {
                IdentPtr pid = m_token.GetIdentifier(this->GetHashTbl());
                if (pid == wellKnownPropertyPids.eval)
                {
                    Error(ERREvalUsage);
                }
                else if (pid == wellKnownPropertyPids.arguments)
                {
                    Error(ERRArgsUsage);
                }
            }

            pidCatch = m_token.GetIdentifier(this->GetHashTbl());
            PidRefStack *ref = this->FindOrAddPidRef(pidCatch, GetCurrentBlock()->blockId, GetCurrentFunctionNode()->functionId);

            ParseNodeName * pnodeParam = CreateNameNode(pidCatch);
            pnodeParam->SetSymRef(ref);

            const char16 *name = reinterpret_cast<const char16*>(pidCatch->Psz());
            int nameLength = pidCatch->Cch();
            SymbolName const symName(name, nameLength);
            Symbol *sym = Anew(&m_nodeAllocator, Symbol, symName, pnodeParam, STVariable);
            if (sym == nullptr)
            {
                Error(ERRnoMemory);
            }
            sym->SetPid(pidCatch);
            Assert(ref->GetSym() == nullptr);
            ref->SetSym(sym);

            Scope *scope = pnodeCatchScope->scope;
            scope->AddNewSymbol(sym);

            if (buildAST)
            {
                pnode->SetParam(pnodeParam);
                pnode->scope = scope;
            }

            this->GetScanner()->Scan();
        }
        else
        {
            if (buildAST)
            {
                pnode->scope = pnodeCatchScope->scope;
            }
        }

        charcount_t ichLim;
        if (buildAST)
        {
            ichLim = this->GetScanner()->IchLimTok();
        }

        if (hasParam)
        {
            ChkCurTok(tkRParen, ERRnoRparen); //catch(id[:expr])
        }

        if (tkLCurly != m_token.tk)
        {
            Error(ERRnoLcurly);
        }

        ParseNodePtr pnodeBody = ParseStatement<buildAST>();  //catch(id[:expr]) {block}
        if (buildAST)
        {
            pnode->pnodeBody = pnodeBody;
            pnode->ichLim = ichLim;
        }

        if (pnodeCatchScope != nullptr)
        {
            FinishParseBlock(pnodeCatchScope);
        }

        if (pnodeCatchScope->GetCallsEval() || pnodeCatchScope->GetChildCallsEval())
        {
            GetCurrentBlock()->SetChildCallsEval(true);
        }

        if (pnodeCatchScope->GetCallsEval())
        {
            pnodeBody->AsParseNodeBlock()->SetCallsEval(true);
        }
        if (pnodeCatchScope->GetChildCallsEval())
        {
            pnodeBody->AsParseNodeBlock()->SetChildCallsEval(true);
        }

        if (buildAST)
        {
            PopStmt(&stmt);

            // Restore the lists of function expression scopes.

            Assert(m_ppnodeExprScope);
            Assert(*m_ppnodeExprScope == nullptr);
            m_ppnodeExprScope = ppnodeExprScopeSave;
        }
    }
    return pnode;
}